

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O1

void __thiscall JetHead::vector<Regex::GroupData>::clear(vector<Regex::GroupData> *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->mSize != 0) {
    lVar3 = 0x18;
    uVar4 = 0;
    do {
      plVar1 = *(long **)((long)this->mData + lVar3 + -0x10);
      plVar2 = (long *)((long)&this->mData->start_pos + lVar3);
      if (plVar2 != plVar1) {
        operator_delete(plVar1,*plVar2 + 1);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < this->mSize);
  }
  this->mSize = 0;
  return;
}

Assistant:

void clear() 
		{ 
			// Call destructor-in-place, not delete (we didn't
			// allocate this object with new).  Destroy everything.
			for (unsigned i = 0; i < mSize; i++)
			{
				mData[i].~T();
			}

			// Nothing is left
			mSize = 0; 
		}